

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O0

Reals __thiscall
Omega_h::measure_ents_real(Omega_h *this,Mesh *mesh,Int ent_dim,LOs *a2e,Reals *coords)

{
  Mesh *pMVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar3;
  Reals RVar4;
  Read<double> local_100;
  Read<int> local_f0;
  Read<double> local_e0;
  Read<int> local_d0;
  Read<double> local_c0;
  Read<int> local_b0;
  Read<double> local_a0;
  Read<int> local_90;
  Read<double> local_80;
  Read<int> local_70 [2];
  Read<double> local_50;
  Read<int> local_40;
  Reals *local_30;
  Reals *coords_local;
  LOs *a2e_local;
  Mesh *pMStack_18;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  local_30 = coords;
  coords_local = (Reals *)a2e;
  a2e_local._4_4_ = ent_dim;
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  IVar2 = Mesh::dim(mesh);
  pMVar1 = pMStack_18;
  if ((IVar2 == 3) && (a2e_local._4_4_ == 3)) {
    Read<int>::Read(&local_40,a2e);
    Read<double>::Read(&local_50,coords);
    measure_ents_real_tmpl<3,3>(this,pMVar1,&local_40,&local_50);
    Read<double>::~Read(&local_50);
    Read<int>::~Read(&local_40);
    pvVar3 = extraout_RDX;
  }
  else {
    IVar2 = Mesh::dim(pMStack_18);
    pMVar1 = pMStack_18;
    if ((IVar2 == 3) && (a2e_local._4_4_ == 2)) {
      Read<int>::Read(local_70,a2e);
      Read<double>::Read(&local_80,coords);
      measure_ents_real_tmpl<3,2>(this,pMVar1,local_70,&local_80);
      Read<double>::~Read(&local_80);
      Read<int>::~Read(local_70);
      pvVar3 = extraout_RDX_00;
    }
    else {
      IVar2 = Mesh::dim(pMStack_18);
      pMVar1 = pMStack_18;
      if ((IVar2 == 3) && (a2e_local._4_4_ == 1)) {
        Read<int>::Read(&local_90,a2e);
        Read<double>::Read(&local_a0,coords);
        measure_ents_real_tmpl<3,1>(this,pMVar1,&local_90,&local_a0);
        Read<double>::~Read(&local_a0);
        Read<int>::~Read(&local_90);
        pvVar3 = extraout_RDX_01;
      }
      else {
        IVar2 = Mesh::dim(pMStack_18);
        pMVar1 = pMStack_18;
        if ((IVar2 == 2) && (a2e_local._4_4_ == 2)) {
          Read<int>::Read(&local_b0,a2e);
          Read<double>::Read(&local_c0,coords);
          measure_ents_real_tmpl<2,2>(this,pMVar1,&local_b0,&local_c0);
          Read<double>::~Read(&local_c0);
          Read<int>::~Read(&local_b0);
          pvVar3 = extraout_RDX_02;
        }
        else {
          IVar2 = Mesh::dim(pMStack_18);
          pMVar1 = pMStack_18;
          if ((IVar2 == 2) && (a2e_local._4_4_ == 1)) {
            Read<int>::Read(&local_d0,a2e);
            Read<double>::Read(&local_e0,coords);
            measure_ents_real_tmpl<2,1>(this,pMVar1,&local_d0,&local_e0);
            Read<double>::~Read(&local_e0);
            Read<int>::~Read(&local_d0);
            pvVar3 = extraout_RDX_03;
          }
          else {
            IVar2 = Mesh::dim(pMStack_18);
            pMVar1 = pMStack_18;
            if ((IVar2 != 1) || (a2e_local._4_4_ != 1)) {
              fail("assertion %s failed at %s +%d\n","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
                   ,0x50);
            }
            Read<int>::Read(&local_f0,a2e);
            Read<double>::Read(&local_100,coords);
            measure_ents_real_tmpl<1,1>(this,pMVar1,&local_f0,&local_100);
            Read<double>::~Read(&local_100);
            Read<int>::~Read(&local_f0);
            pvVar3 = extraout_RDX_04;
          }
        }
      }
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals measure_ents_real(Mesh* mesh, Int ent_dim, LOs a2e, Reals coords) {
  if (mesh->dim() == 3 && ent_dim == 3)
    return measure_ents_real_tmpl<3, 3>(mesh, a2e, coords);
  if (mesh->dim() == 3 && ent_dim == 2)
    return measure_ents_real_tmpl<3, 2>(mesh, a2e, coords);
  if (mesh->dim() == 3 && ent_dim == 1)
    return measure_ents_real_tmpl<3, 1>(mesh, a2e, coords);
  if (mesh->dim() == 2 && ent_dim == 2)
    return measure_ents_real_tmpl<2, 2>(mesh, a2e, coords);
  if (mesh->dim() == 2 && ent_dim == 1)
    return measure_ents_real_tmpl<2, 1>(mesh, a2e, coords);
  if (mesh->dim() == 1 && ent_dim == 1)
    return measure_ents_real_tmpl<1, 1>(mesh, a2e, coords);
  OMEGA_H_NORETURN(Reals());
}